

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O2

void av1_copy_mbmi_ext_to_mbmi_ext_frame
               (MB_MODE_INFO_EXT_FRAME *mbmi_ext_best,MB_MODE_INFO_EXT *mbmi_ext,
               uint8_t ref_frame_type)

{
  CANDIDATE_MV *pCVar1;
  CANDIDATE_MV CVar2;
  CANDIDATE_MV CVar3;
  CANDIDATE_MV CVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  
  uVar8 = CONCAT71(in_register_00000011,ref_frame_type) & 0xffffffff;
  uVar9 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ref_frame_type) << 5);
  pCVar1 = (CANDIDATE_MV *)((long)&mbmi_ext->ref_mv_stack[0][0].this_mv + uVar9);
  CVar2 = *pCVar1;
  CVar3 = pCVar1[1];
  pCVar1 = (CANDIDATE_MV *)((long)&mbmi_ext->ref_mv_stack[0][2].this_mv + uVar9);
  CVar4 = pCVar1[1];
  mbmi_ext_best->ref_mv_stack[2] = *pCVar1;
  mbmi_ext_best->ref_mv_stack[3] = CVar4;
  mbmi_ext_best->ref_mv_stack[0] = CVar2;
  mbmi_ext_best->ref_mv_stack[1] = CVar3;
  *&mbmi_ext_best->weight = mbmi_ext->weight[uVar8];
  mbmi_ext_best->mode_context = mbmi_ext->mode_context[uVar8];
  mbmi_ext_best->ref_mv_count = mbmi_ext->ref_mv_count[uVar8];
  uVar5 = *(undefined8 *)(mbmi_ext->global_mvs + 2);
  uVar6 = *(undefined8 *)(mbmi_ext->global_mvs + 4);
  uVar7 = *(undefined8 *)(mbmi_ext->global_mvs + 6);
  *(undefined8 *)mbmi_ext_best->global_mvs = *(undefined8 *)mbmi_ext->global_mvs;
  *(undefined8 *)(mbmi_ext_best->global_mvs + 2) = uVar5;
  *(undefined8 *)(mbmi_ext_best->global_mvs + 4) = uVar6;
  *(undefined8 *)(mbmi_ext_best->global_mvs + 6) = uVar7;
  return;
}

Assistant:

static inline void av1_copy_mbmi_ext_to_mbmi_ext_frame(
    MB_MODE_INFO_EXT_FRAME *mbmi_ext_best,
    const MB_MODE_INFO_EXT *const mbmi_ext, uint8_t ref_frame_type) {
  memcpy(mbmi_ext_best->ref_mv_stack, mbmi_ext->ref_mv_stack[ref_frame_type],
         sizeof(mbmi_ext->ref_mv_stack[USABLE_REF_MV_STACK_SIZE]));
  memcpy(mbmi_ext_best->weight, mbmi_ext->weight[ref_frame_type],
         sizeof(mbmi_ext->weight[USABLE_REF_MV_STACK_SIZE]));
  mbmi_ext_best->mode_context = mbmi_ext->mode_context[ref_frame_type];
  mbmi_ext_best->ref_mv_count = mbmi_ext->ref_mv_count[ref_frame_type];
  memcpy(mbmi_ext_best->global_mvs, mbmi_ext->global_mvs,
         sizeof(mbmi_ext->global_mvs));
}